

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

string_t duckdb::UncompressedStringStorage::ReadStringWithLength(data_ptr_t target,int32_t offset)

{
  uint uVar1;
  ulong __n;
  uint *__src;
  string_t sVar2;
  uint uStack_14;
  undefined4 uStack_10;
  undefined4 local_c;
  
  __src = (uint *)((long)(target + offset) + 4);
  uVar1 = *(uint *)(target + offset);
  __n = (ulong)uVar1;
  if (__n < 0xd) {
    local_c = 0;
    uStack_14 = 0;
    uStack_10 = 0;
    if (__n == 0) {
      __src = (uint *)0x0;
    }
    else {
      switchD_00916250::default(&uStack_14,__src,__n);
      __src = (uint *)CONCAT44(local_c,uStack_10);
    }
  }
  else {
    uStack_14 = *__src;
  }
  sVar2.value._4_1_ = (undefined1)uStack_14;
  sVar2.value._5_1_ = uStack_14._1_1_;
  sVar2.value._6_1_ = uStack_14._2_1_;
  sVar2.value._7_1_ = uStack_14._3_1_;
  sVar2.value.pointer.length = uVar1;
  sVar2.value.pointer.ptr = (char *)__src;
  return (string_t)sVar2.value;
}

Assistant:

string_t UncompressedStringStorage::ReadStringWithLength(data_ptr_t target, int32_t offset) {
	auto ptr = target + offset;
	auto str_length = Load<uint32_t>(ptr);
	auto str_ptr = char_ptr_cast(ptr + sizeof(uint32_t));
	return string_t(str_ptr, str_length);
}